

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

int vrna_params_load_from_string(char *string,char *name,uint options)

{
  int iVar1;
  char *__ptr;
  char *pcVar2;
  void *p;
  char **file_content;
  uint size;
  long lVar3;
  long lVar4;
  char **ppcVar5;
  char *rest;
  char *local_38;
  
  if (string == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    __ptr = strdup(string);
    size = 0x40000;
    p = (void *)0x0;
    lVar4 = 0;
    lVar3 = 0;
    pcVar2 = __ptr;
    while( true ) {
      pcVar2 = strtok_r(pcVar2,"\n",&local_38);
      if (pcVar2 == (char *)0x0) break;
      if (lVar4 == lVar3) {
        lVar3 = lVar4 + 0x8000;
        p = vrna_realloc(p,size);
      }
      pcVar2 = strdup(pcVar2);
      *(char **)((long)p + lVar4 * 8) = pcVar2;
      lVar4 = lVar4 + 1;
      size = size + 8;
      pcVar2 = (char *)0x0;
    }
    file_content = (char **)vrna_realloc(p,size - 0x3fff8);
    file_content[lVar4] = (char *)0x0;
    iVar1 = set_parameters_from_string(file_content,name);
    free(__ptr);
    for (ppcVar5 = file_content; *ppcVar5 != (char *)0x0; ppcVar5 = ppcVar5 + 1) {
      free(*ppcVar5);
    }
    free(file_content);
  }
  return iVar1;
}

Assistant:

PUBLIC int
vrna_params_load_from_string(const char   *string,
                             const char   *name,
                             unsigned int options)
{
  int ret = 0;

  if (string) {
    char    **params_array, **ptr, *tmp_string, *token, *rest;
    size_t  lines, lines_mem;

    lines         = lines_mem = 0;
    params_array  = NULL;

    /* convert string into array of lines */
    tmp_string = strdup(string);

    token = strtok_r(tmp_string, "\n", &rest);

    while (token != NULL) {
      if (lines == lines_mem) {
        lines_mem     += 32768;
        params_array  = (char **)vrna_realloc(params_array, sizeof(char *) * lines_mem);
      }

      params_array[lines++] = strdup(token);

      token = strtok_r(NULL, "\n", &rest);
    }

    /* reallocate to actual requirements */
    params_array        = (char **)vrna_realloc(params_array, sizeof(char *) * (lines + 1));
    params_array[lines] = NULL;

    /* actually apply parameters */
    ret = set_parameters_from_string(params_array,
                                     name);

    /* cleanup memory */
    free(tmp_string);

    for (ptr = params_array; *ptr != NULL; ptr++)
      free(*ptr);

    free(params_array);
  }

  return ret;
}